

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_lower(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *s;
  luaL_Buffer b;
  size_t i;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  pcVar2 = luaL_checklstring(L,1,&i);
  luaL_buffinit((lua_State *)l,(luaL_Buffer *)&s);
  b.buffer[0x1ff8] = '\0';
  b.buffer[0x1ff9] = '\0';
  b.buffer[0x1ffa] = '\0';
  b.buffer[0x1ffb] = '\0';
  b.buffer[0x1ffc] = '\0';
  b.buffer[0x1ffd] = '\0';
  b.buffer[0x1ffe] = '\0';
  b.buffer[0x1fff] = '\0';
  for (; (ulong)b.buffer._8184_8_ < i; b.buffer._8184_8_ = b.buffer._8184_8_ + 1) {
    if (b.buffer + 0x1ff8 <= s) {
      luaL_prepbuffer((luaL_Buffer *)&s);
    }
    iVar1 = tolower((uint)(byte)pcVar2[b.buffer._8184_8_]);
    *s = (char)iVar1;
    s = s + 1;
  }
  luaL_pushresult((luaL_Buffer *)&s);
  return 1;
}

Assistant:

static int str_lower (lua_State *L) {
  size_t l;
  size_t i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  luaL_buffinit(L, &b);
  for (i=0; i<l; i++)
    luaL_addchar(&b, tolower(uchar(s[i])));
  luaL_pushresult(&b);
  return 1;
}